

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O1

size_t sylvan_serialize_assign_rec(BDD bdd)

{
  uint8_t *puVar1;
  size_t sVar2;
  avl_node_t *paVar3;
  long lVar4;
  int inserted;
  sylvan_ser s;
  int local_2c;
  sylvan_ser local_28;
  
  local_28.bdd = bdd & 0x7fffffffffffffff;
  if ((avl_node *)local_28.bdd != (avl_node *)0x0) {
    puVar1 = nodes->data;
    lVar4 = (bdd & 0xffffffffff) * 0x10;
    for (paVar3 = sylvan_ser_set; paVar3 != (avl_node_t *)0x0;
        paVar3 = *(avl_node_t **)(paVar3->pad + (ulong)(paVar3[1].left <= local_28.bdd) * 8 + -0x14)
        ) {
      if (paVar3[1].left == (avl_node *)local_28.bdd) {
        paVar3 = paVar3 + 1;
        goto LAB_0010feee;
      }
    }
    paVar3 = (avl_node_t *)0x0;
LAB_0010feee:
    if (paVar3 == (avl_node_t *)0x0) {
      local_28.assigned = 0;
      paVar3 = (avl_node_t *)sylvan_ser_put(&sylvan_ser_set,&local_28,(int *)0x0);
      sylvan_serialize_assign_rec(*(ulong *)(puVar1 + lVar4 + 8) & 0xffffffffff);
      sylvan_serialize_assign_rec(*(ulong *)(puVar1 + lVar4) & 0x800000ffffffffff);
      sVar2 = sylvan_ser_counter + 1;
      paVar3->right = (avl_node *)sylvan_ser_counter;
      sylvan_ser_counter = sVar2;
      local_2c = 0;
      sylvan_ser_reversed_put(&sylvan_ser_reversed_set,(sylvan_ser *)paVar3,&local_2c);
    }
    local_28.bdd = (BDD)paVar3->right;
  }
  return local_28.bdd;
}

Assistant:

static size_t
sylvan_serialize_assign_rec(BDD bdd)
{
    if (sylvan_isnode(bdd)) {
        bddnode_t n = MTBDD_GETNODE(bdd);

        struct sylvan_ser s, *ss;
        s.bdd = BDD_STRIPMARK(bdd);
        ss = sylvan_ser_search(sylvan_ser_set, &s);
        if (ss == NULL) {
            // assign dummy value
            s.assigned = 0;
            ss = sylvan_ser_put(&sylvan_ser_set, &s, NULL);

            // first assign recursively
            sylvan_serialize_assign_rec(bddnode_getlow(n));
            sylvan_serialize_assign_rec(bddnode_gethigh(n));

            // assign real value
            ss->assigned = sylvan_ser_counter++;

            // put a copy in the reversed table
            sylvan_ser_reversed_insert(&sylvan_ser_reversed_set, ss);
        }

        return ss->assigned;
    }

    return BDD_STRIPMARK(bdd);
}